

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::RepeatedPrimitiveFieldGenerator::GenerateMergingCodeFromPacked
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  Type TVar1;
  int iVar2;
  Printer *printer_local;
  RepeatedPrimitiveFieldGenerator *this_local;
  
  io::Printer::Print(printer,
                     "int length = input.readRawVarint32();\nint limit = input.pushLimit(length);\n"
                    );
  TVar1 = FieldDescriptor::type(this->descriptor_);
  if (TVar1 != TYPE_BOOL) {
    TVar1 = FieldDescriptor::type(this->descriptor_);
    iVar2 = anon_unknown_5::FixedSize(TVar1);
    if (iVar2 != -1) {
      io::Printer::Print(printer,&this->variables_,"int arrayLength = length / $fixed_size$;\n");
      goto LAB_00489105;
    }
  }
  io::Printer::Print(printer,&this->variables_,
                     "// First pass to compute array length.\nint arrayLength = 0;\nint startPos = input.getPosition();\nwhile (input.getBytesUntilLimit() > 0) {\n  input.read$capitalized_type$();\n  arrayLength++;\n}\ninput.rewindToPosition(startPos);\n"
                    );
LAB_00489105:
  io::Printer::Print(printer,&this->variables_,
                     "int i = this.$name$ == null ? 0 : this.$name$.length;\n$type$[] newArray = new $type$[i + arrayLength];\nif (i != 0) {\n  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n}\nfor (; i < newArray.length; i++) {\n  newArray[i] = input.read$capitalized_type$();\n}\nthis.$name$ = newArray;\ninput.popLimit(limit);\n"
                    );
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateMergingCodeFromPacked(io::Printer* printer) const {
  printer->Print(
    "int length = input.readRawVarint32();\n"
    "int limit = input.pushLimit(length);\n");

  // If we know the elements will all be of the same size, the arrayLength
  // can be calculated much more easily. However, FixedSize() returns 1 for
  // repeated bool fields, which are guaranteed to have the fixed size of
  // 1 byte per value only if we control the output. On the wire they can
  // legally appear as variable-size integers, so we need to use the slow
  // way for repeated bool fields.
  if (descriptor_->type() == FieldDescriptor::TYPE_BOOL
      || FixedSize(descriptor_->type()) == -1) {
    printer->Print(variables_,
      "// First pass to compute array length.\n"
      "int arrayLength = 0;\n"
      "int startPos = input.getPosition();\n"
      "while (input.getBytesUntilLimit() > 0) {\n"
      "  input.read$capitalized_type$();\n"
      "  arrayLength++;\n"
      "}\n"
      "input.rewindToPosition(startPos);\n");
  } else {
    printer->Print(variables_,
      "int arrayLength = length / $fixed_size$;\n");
  }

  printer->Print(variables_,
    "int i = this.$name$ == null ? 0 : this.$name$.length;\n"
    "$type$[] newArray = new $type$[i + arrayLength];\n"
    "if (i != 0) {\n"
    "  java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n"
    "}\n"
    "for (; i < newArray.length; i++) {\n"
    "  newArray[i] = input.read$capitalized_type$();\n"
    "}\n"
    "this.$name$ = newArray;\n"
    "input.popLimit(limit);\n");
}